

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O1

void __thiscall randomx::Instruction::h_IADD_M(Instruction *this,ostream *os)

{
  ostream *poVar1;
  uint uVar2;
  uint srcIndex;
  
  uVar2 = this->dst & 7;
  srcIndex = this->src & 7;
  if ((char)uVar2 == (char)srcIndex) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"r",1);
    poVar1 = (ostream *)std::ostream::operator<<(os,uVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
    genAddressImm(this,os);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(os,"r",1);
    poVar1 = (ostream *)std::ostream::operator<<(os,uVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
    genAddressReg(this,os,srcIndex);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
  std::ostream::put((char)os);
  std::ostream::flush();
  return;
}

Assistant:

void Instruction::h_IADD_M(std::ostream& os) const {
		auto dstIndex = dst % RegistersCount;
		auto srcIndex = src % RegistersCount;
		if (dstIndex != srcIndex) {
			os << "r" << dstIndex << ", ";
			genAddressReg(os, srcIndex);
			os << std::endl;
		}
		else {
			os << "r" << dstIndex << ", ";
			genAddressImm(os);
			os << std::endl;
		}
	}